

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

void mbedtls_sha1(uchar *input,size_t ilen,uchar *output)

{
  long lVar1;
  mbedtls_sha1_context local_78;
  
  local_78.total[0] = 0;
  local_78.total[1] = 0;
  local_78.buffer[0x34] = '\0';
  local_78.buffer[0x35] = '\0';
  local_78.buffer[0x36] = '\0';
  local_78.buffer[0x37] = '\0';
  local_78.buffer[0x38] = '\0';
  local_78.buffer[0x39] = '\0';
  local_78.buffer[0x3a] = '\0';
  local_78.buffer[0x3b] = '\0';
  local_78.buffer[0x3c] = '\0';
  local_78.buffer[0x3d] = '\0';
  local_78.buffer[0x3e] = '\0';
  local_78.buffer[0x3f] = '\0';
  local_78.buffer[0x24] = '\0';
  local_78.buffer[0x25] = '\0';
  local_78.buffer[0x26] = '\0';
  local_78.buffer[0x27] = '\0';
  local_78.buffer[0x28] = '\0';
  local_78.buffer[0x29] = '\0';
  local_78.buffer[0x2a] = '\0';
  local_78.buffer[0x2b] = '\0';
  local_78.buffer[0x2c] = '\0';
  local_78.buffer[0x2d] = '\0';
  local_78.buffer[0x2e] = '\0';
  local_78.buffer[0x2f] = '\0';
  local_78.buffer[0x30] = '\0';
  local_78.buffer[0x31] = '\0';
  local_78.buffer[0x32] = '\0';
  local_78.buffer[0x33] = '\0';
  local_78.buffer[0x14] = '\0';
  local_78.buffer[0x15] = '\0';
  local_78.buffer[0x16] = '\0';
  local_78.buffer[0x17] = '\0';
  local_78.buffer[0x18] = '\0';
  local_78.buffer[0x19] = '\0';
  local_78.buffer[0x1a] = '\0';
  local_78.buffer[0x1b] = '\0';
  local_78.buffer[0x1c] = '\0';
  local_78.buffer[0x1d] = '\0';
  local_78.buffer[0x1e] = '\0';
  local_78.buffer[0x1f] = '\0';
  local_78.buffer[0x20] = '\0';
  local_78.buffer[0x21] = '\0';
  local_78.buffer[0x22] = '\0';
  local_78.buffer[0x23] = '\0';
  local_78.buffer[4] = '\0';
  local_78.buffer[5] = '\0';
  local_78.buffer[6] = '\0';
  local_78.buffer[7] = '\0';
  local_78.buffer[8] = '\0';
  local_78.buffer[9] = '\0';
  local_78.buffer[10] = '\0';
  local_78.buffer[0xb] = '\0';
  local_78.buffer[0xc] = '\0';
  local_78.buffer[0xd] = '\0';
  local_78.buffer[0xe] = '\0';
  local_78.buffer[0xf] = '\0';
  local_78.buffer[0x10] = '\0';
  local_78.buffer[0x11] = '\0';
  local_78.buffer[0x12] = '\0';
  local_78.buffer[0x13] = '\0';
  local_78.state[0] = 0x67452301;
  local_78.state[1] = 0xefcdab89;
  local_78.state[2] = 0x98badcfe;
  local_78.state[3] = 0x10325476;
  local_78.state[4] = 0xc3d2e1f0;
  local_78.buffer[0] = '\0';
  local_78.buffer[1] = '\0';
  local_78.buffer[2] = '\0';
  local_78.buffer[3] = '\0';
  mbedtls_sha1_update(&local_78,input,ilen);
  mbedtls_sha1_finish(&local_78,output);
  lVar1 = 0;
  do {
    *(undefined1 *)((long)local_78.total + lVar1) = 0;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0x5c);
  return;
}

Assistant:

void mbedtls_sha1( const unsigned char *input, size_t ilen, unsigned char output[20] )
{
    mbedtls_sha1_context ctx;

    mbedtls_sha1_init( &ctx );
    mbedtls_sha1_starts( &ctx );
    mbedtls_sha1_update( &ctx, input, ilen );
    mbedtls_sha1_finish( &ctx, output );
    mbedtls_sha1_free( &ctx );
}